

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

void __thiscall ddd::DaTrie<true,_false,_true>::DaTrie(DaTrie<true,_false,_true> *this,istream *is)

{
  pointer pcVar1;
  pointer pBVar2;
  pointer pNVar3;
  size_t size;
  size_type local_30;
  
  (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->blocks_).super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->blocks_).super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->blocks_).super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  this->head_pos_ = 0xffffffff;
  this->bc_emps_ = 0;
  this->tail_emps_ = 0;
  if ((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  local_30 = 0;
  std::istream::read((char *)is,(long)&local_30);
  std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::resize(&this->bc_,local_30);
  std::istream::read((char *)is,
                     (long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl
                           .super__Vector_impl_data._M_start);
  pcVar1 = (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish != pcVar1) {
    (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar1;
  }
  local_30 = 0;
  std::istream::read((char *)is,(long)&local_30);
  std::vector<char,_std::allocator<char>_>::resize(&this->tail_,local_30);
  std::istream::read((char *)is,
                     (long)(this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start);
  pBVar2 = (this->blocks_).super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->blocks_).super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>._M_impl.
      super__Vector_impl_data._M_finish != pBVar2) {
    (this->blocks_).super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>._M_impl.
    super__Vector_impl_data._M_finish = pBVar2;
  }
  local_30 = 0;
  std::istream::read((char *)is,(long)&local_30);
  std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::resize(&this->blocks_,local_30);
  std::istream::read((char *)is,
                     (long)(this->blocks_).
                           super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>.
                           _M_impl.super__Vector_impl_data._M_start);
  pNVar3 = (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl.
      super__Vector_impl_data._M_finish != pNVar3) {
    (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl.
    super__Vector_impl_data._M_finish = pNVar3;
  }
  local_30 = 0;
  std::istream::read((char *)is,(long)&local_30);
  std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::resize(&this->node_links_,local_30);
  std::istream::read((char *)is,
                     (long)(this->node_links_).
                           super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl
                           .super__Vector_impl_data._M_start);
  std::istream::read((char *)is,(long)&this->head_pos_);
  std::istream::read((char *)is,(long)&this->bc_emps_);
  std::istream::read((char *)is,(long)&this->tail_emps_);
  return;
}

Assistant:

DaTrie(std::istream& is) {
    utils::read_vector(bc_, is);
    utils::read_vector(tail_, is);
    utils::read_vector(blocks_, is);
    utils::read_vector(node_links_, is);
    utils::read_value(head_pos_, is);
    utils::read_value(bc_emps_, is);
    utils::read_value(tail_emps_, is);
  }